

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarkerHelpers.hpp
# Opt level: O0

bool __thiscall
bredis::marker_helpers::
equality<boost::asio::buffers_iterator<std::vector<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_>,_char>_>
::operator()(equality<boost::asio::buffers_iterator<std::vector<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_>,_char>_>
             *this,int_t<boost::asio::buffers_iterator<std::vector<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_>,_char>_>
                   *value)

{
  buffers_iterator<std::vector<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_>,_char>
  first2;
  buffers_iterator<std::vector<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_>,_char>
  last2;
  bool bVar1;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  size_t local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  size_t local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  int_t<boost::asio::buffers_iterator<std::vector<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_>,_char>_>
  *local_18;
  int_t<boost::asio::buffers_iterator<std::vector<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_>,_char>_>
  *value_local;
  equality<boost::asio::buffers_iterator<std::vector<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_>,_char>_>
  *this_local;
  
  local_20._M_current = (this->begin_)._M_current;
  local_28._M_current = (this->end_)._M_current;
  local_18 = value;
  value_local = (int_t<boost::asio::buffers_iterator<std::vector<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_>,_char>_>
                 *)this;
  memcpy(&local_60,value,0x38);
  memcpy(&local_98,&(local_18->string).to,0x38);
  first2.current_buffer_.size_ = uStack_58;
  first2.current_buffer_.data_ = (void *)local_60;
  first2.current_buffer_position_ = local_50;
  first2.begin_._M_current = (const_buffer *)uStack_48;
  first2.current_._M_current = (const_buffer *)local_40;
  first2.end_._M_current = (const_buffer *)uStack_38;
  first2.position_ = local_30;
  last2.current_buffer_.size_ = uStack_90;
  last2.current_buffer_.data_ = (void *)local_98;
  last2.current_buffer_position_ = local_88;
  last2.begin_._M_current = (const_buffer *)uStack_80;
  last2.current_._M_current = (const_buffer *)local_78;
  last2.end_._M_current = (const_buffer *)uStack_70;
  last2.position_ = local_68;
  bVar1 = boost::algorithm::
          equal<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::asio::buffers_iterator<std::vector<boost::asio::const_buffer,std::allocator<boost::asio::const_buffer>>,char>>
                    (local_20,local_28,first2,last2);
  return bVar1;
}

Assistant:

bool operator()(const markers::int_t<Iterator> &value) const {
        return boost::algorithm::equal(begin_, end_, value.string.from,
                                       value.string.to);
    }